

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

Token * __thiscall Tokenizer::parseChar(Token *__return_storage_ptr__,Tokenizer *this)

{
  _Storage<char,_true> __rhs;
  optional<char> oVar1;
  optional<char> oVar2;
  TokenizerException *pTVar3;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  *this_00;
  allocator<char> local_b1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_70;
  char acStack_50 [8];
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_48;
  
  oVar1 = next(this);
  if (((ushort)oVar1.super__Optional_base<char,_true,_true>._M_payload.
               super__Optional_payload_base<char> >> 8 & 1) == 0) {
    pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"Expected char constant, found EOF",(allocator<char> *)&local_90)
    ;
    TokenizerException::TokenizerException
              (pTVar3,&local_b0,this->line_number,this->col_number,&this->current_line);
    __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
  }
  oVar2 = next(this);
  __rhs._M_value =
       oVar2.super__Optional_base<char,_true,_true>._M_payload.super__Optional_payload_base<char>.
       _M_payload;
  if (oVar1.super__Optional_base<char,_true,_true>._M_payload.super__Optional_payload_base<char>.
      _M_payload == '\\') {
    if (((ushort)oVar2.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"Expected char constant, found EOF",
                 (allocator<char> *)&local_90);
      TokenizerException::TokenizerException
                (pTVar3,&local_b0,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
    }
    oVar1 = next(this);
    if (((ushort)oVar1.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"Expected `\'`, found EOF",(allocator<char> *)&local_90);
      TokenizerException::TokenizerException
                (pTVar3,&local_b0,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (oVar1.super__Optional_base<char,_true,_true>._M_payload.super__Optional_payload_base<char>.
        _M_payload != '\'') {
      pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"Expected `\'`, found ",&local_b1);
      std::operator+(&local_b0,&local_90,
                     oVar1.super__Optional_base<char,_true,_true>._M_payload.
                     super__Optional_payload_base<char>._M_payload);
      TokenizerException::TokenizerException
                (pTVar3,&local_b0,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48._M_first._M_storage._0_1_ = doBackslash(__rhs._M_value);
    this_00 = (_Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
               *)(acStack_50 + 8);
  }
  else {
    if (((ushort)oVar2.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"Expected `\'`, found EOF",(allocator<char> *)&local_90);
      TokenizerException::TokenizerException
                (pTVar3,&local_b0,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (__rhs._M_value != '\'') {
      pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"Expected `\'`, found ",&local_b1);
      std::operator+(&local_b0,&local_90,__rhs._M_value);
      TokenizerException::TokenizerException
                (pTVar3,&local_b0,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = &local_70;
    local_70._M_first._M_storage._0_1_ =
         oVar1.super__Optional_base<char,_true,_true>._M_payload.super__Optional_payload_base<char>.
         _M_payload;
  }
  *(undefined1 *)(this_00 + 1) = 4;
  __return_storage_ptr__->type = Char;
  std::__detail::__variant::
  _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)&__return_storage_ptr__->value,
                    (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)&this_00->_M_first);
  std::__detail::__variant::
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::~_Variant_storage((_Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&this_00->_M_first);
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::parseChar() {
    optional<char> _ = next();
    if (!_.has_value()) {
        throw TokenizerException("Expected char constant, found EOF", line_number, col_number, current_line);
    }
    char c = _.value();
    if (c == '\\') {
        // Get char after backslash
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException("Expected char constant, found EOF", line_number, col_number, current_line);
        }
        char nextC = _.value();
        // Ensure it ends with a '
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException("Expected `'`, found EOF", line_number, col_number, current_line);
        }
        if (_.value() != '\'') {
            throw TokenizerException(string("Expected `'`, found ") + _.value(), line_number, col_number, current_line);
        }
        return Token(Char, doBackslash(nextC));
    } else {
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException("Expected `'`, found EOF", line_number, col_number, current_line);
        }
        if (_.value() != '\'') {
            throw TokenizerException(string("Expected `'`, found ") + _.value(), line_number, col_number, current_line);
        }
        return Token(Char, c);
    }
}